

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int *piVar1;
  byte bVar2;
  sqlite3 *db;
  sqlite3 *db_00;
  Btree *pBVar3;
  Db *pDVar4;
  Pager *pPVar5;
  char *pcVar6;
  Schema *pSVar7;
  bool bVar8;
  u8 uVar9;
  undefined6 uVar10;
  u8 uVar11;
  u8 uVar12;
  undefined6 uVar13;
  u8 *puVar14;
  int iVar15;
  int iVar16;
  char *zUri;
  char *pcVar17;
  Db *pDVar18;
  Schema *pSVar19;
  int iVar20;
  Btree **p;
  long lVar21;
  char *pcVar22;
  uint vfsFlags;
  Btree *pBVar23;
  char *zErrDyn;
  uint flags;
  sqlite3_vfs *pVfs;
  char *zErr;
  char *zPath;
  char *local_70;
  undefined8 local_68;
  Btree **local_60;
  sqlite3_context *local_58;
  u8 *local_50;
  sqlite3_vfs *local_48;
  char *local_40;
  Btree **local_38;
  
  db = context->pOut->db;
  local_38 = (Btree **)0x0;
  local_40 = (char *)0x0;
  local_70 = (char *)0x0;
  local_58 = context;
  zUri = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar17 = (char *)sqlite3ValueText(argv[1],'\x01');
  if (zUri == (char *)0x0) {
    zUri = "";
  }
  if (pcVar17 == (char *)0x0) {
    pcVar17 = "";
  }
  if (((db->init).field_0x6 & 4) == 0) {
    iVar16 = db->nDb;
    if (iVar16 < db->aLimit[7] + 2) {
      db_00 = (sqlite3 *)db->aDb;
      if (0 < iVar16) {
        iVar20 = 0;
        do {
          iVar15 = sqlite3DbIsNamed(db_00,iVar20,pcVar17);
          if (iVar15 != 0) {
            pcVar22 = "database %s is already in use";
            iVar16 = 0;
            goto LAB_0019cb66;
          }
          iVar20 = iVar20 + 1;
        } while (iVar16 != iVar20);
      }
      if (db_00 == (sqlite3 *)db->aDbStatic) {
        pDVar18 = (Db *)sqlite3DbMallocRawNN(db,0x60);
        if (pDVar18 == (Db *)0x0) {
          return;
        }
        pDVar4 = db->aDb;
        pcVar22 = pDVar4->zDbSName;
        pBVar23 = pDVar4->pBt;
        uVar11 = pDVar4->safety_level;
        uVar12 = pDVar4->bSyncSet;
        uVar13 = *(undefined6 *)&pDVar4->field_0x12;
        pSVar19 = pDVar4->pSchema;
        pcVar6 = pDVar4[1].zDbSName;
        pBVar3 = pDVar4[1].pBt;
        uVar9 = pDVar4[1].bSyncSet;
        uVar10 = *(undefined6 *)&pDVar4[1].field_0x12;
        pSVar7 = pDVar4[1].pSchema;
        pDVar18[1].safety_level = pDVar4[1].safety_level;
        pDVar18[1].bSyncSet = uVar9;
        *(undefined6 *)&pDVar18[1].field_0x12 = uVar10;
        pDVar18[1].pSchema = pSVar7;
        pDVar18[1].zDbSName = pcVar6;
        pDVar18[1].pBt = pBVar3;
        pDVar18->safety_level = uVar11;
        pDVar18->bSyncSet = uVar12;
        *(undefined6 *)&pDVar18->field_0x12 = uVar13;
        pDVar18->pSchema = pSVar19;
        pDVar18->zDbSName = pcVar22;
        pDVar18->pBt = pBVar23;
      }
      else {
        pDVar18 = (Db *)sqlite3DbRealloc(db,db_00,(long)iVar16 * 0x20 + 0x20);
        if (pDVar18 == (Db *)0x0) {
          return;
        }
      }
      db->aDb = pDVar18;
      iVar16 = db->nDb;
      pDVar4 = pDVar18 + iVar16;
      pDVar4->safety_level = '\0';
      pDVar4->bSyncSet = '\0';
      *(undefined6 *)&pDVar4->field_0x12 = 0;
      *(Schema **)(&pDVar4->safety_level + 8) = (Schema *)0x0;
      pDVar18[iVar16].zDbSName = (char *)0x0;
      pDVar18[iVar16].pBt = (Btree *)0x0;
      local_68._0_4_ = db->openFlags;
      iVar20 = sqlite3ParseUri(db->pVfs->zName,zUri,(uint *)&local_68,&local_48,(char **)&local_38,
                               &local_40);
      p = local_38;
      if (iVar20 != 0) {
        if (iVar20 == 7) {
          sqlite3OomFault(db);
        }
        pcVar17 = local_40;
        local_58->isError = 1;
        sqlite3VdbeMemSetStr
                  (local_58->pOut,local_40,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(pcVar17);
        return;
      }
      pDVar18 = pDVar18 + iVar16;
      vfsFlags = (uint)local_68 | 0x100;
      local_68 = (Btree *)(CONCAT44(local_68._4_4_,(uint)local_68) | 0x100);
      local_60 = &pDVar18->pBt;
      iVar16 = sqlite3BtreeOpen(local_48,(char *)local_38,db,local_60,0,vfsFlags);
      db->nDb = db->nDb + 1;
      pcVar17 = sqlite3DbStrDup(db,pcVar17);
      pDVar18->zDbSName = pcVar17;
      db->noSharedCache = '\0';
      if (iVar16 == 0x13) {
        local_70 = sqlite3MPrintf(db,"database is already attached");
        iVar16 = 1;
      }
      else if (iVar16 == 0) {
        pBVar23 = *local_60;
        goto LAB_0019cae4;
      }
      pDVar18->safety_level = '\x03';
      goto LAB_0019ce09;
    }
    iVar16 = 0;
    local_70 = sqlite3MPrintf(db,"too many attached databases - max %d");
LAB_0019ce9d:
    if (local_70 != (char *)0x0) goto LAB_0019cea2;
  }
  else {
    local_68 = (Btree *)0x0;
    local_48 = sqlite3_vfs_find("memdb");
    if (local_48 == (sqlite3_vfs *)0x0) {
      return;
    }
    iVar16 = sqlite3BtreeOpen(local_48,"x",db,(Btree **)&local_68,0,0x100);
    pBVar23 = local_68;
    if (iVar16 != 0) goto LAB_0019cee2;
    pSVar19 = sqlite3SchemaGet(db,local_68);
    if (pSVar19 == (Schema *)0x0) {
      sqlite3BtreeClose(pBVar23);
      iVar16 = 7;
      goto LAB_0019cee2;
    }
    bVar2 = (db->init).iDb;
    pDVar18 = db->aDb + bVar2;
    pBVar3 = db->aDb[bVar2].pBt;
    if (pBVar3 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar3);
    }
    pDVar18->pBt = pBVar23;
    pDVar18->pSchema = pSVar19;
    db->noSharedCache = '\0';
    p = (Btree **)0x0;
LAB_0019cae4:
    local_50 = &db->noSharedCache;
    local_60 = p;
    pSVar19 = sqlite3SchemaGet(db,pBVar23);
    pDVar18->pSchema = pSVar19;
    iVar16 = 0;
    if (pSVar19 == (Schema *)0x0) {
      iVar16 = 7;
      bVar8 = false;
    }
    else {
      bVar8 = true;
      if ((pSVar19->file_format != '\0') && (pSVar19->enc != db->enc)) {
        bVar8 = false;
        local_70 = sqlite3MPrintf(db,
                                  "attached databases must use the same text encoding as main database"
                                 );
        iVar16 = 1;
      }
    }
    pBVar23 = pDVar18->pBt;
    if ((pBVar23->sharable != '\0') &&
       (pBVar23->wantToLock = pBVar23->wantToLock + 1, pBVar23->locked == '\0')) {
      btreeLockCarefully(pBVar23);
      pBVar23 = pDVar18->pBt;
    }
    pPVar5 = pBVar23->pBt->pPager;
    if (pPVar5->tempFile == '\0') {
      if ((pPVar5->pWal == (Wal *)0x0) || (pPVar5->pWal->exclusiveMode != '\x02')) {
        pPVar5->exclusiveMode = db->dfltLockMode;
      }
    }
    iVar20 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
    sqlite3BtreeSecureDelete(pBVar23,iVar20);
    sqlite3BtreeSetPagerFlags(pDVar18->pBt,(uint)db->flags & 0x38 | 3);
    pBVar23 = pDVar18->pBt;
    if (pBVar23->sharable != '\0') {
      piVar1 = &pBVar23->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(pBVar23);
      }
    }
    pDVar18->safety_level = '\x03';
    p = local_60;
    if (bVar8) {
      if (pDVar18->zDbSName == (char *)0x0) {
        iVar16 = 7;
        goto LAB_0019ce09;
      }
      sqlite3_free_filename((char *)local_60);
      puVar14 = local_50;
      if (*local_50 == '\0') {
        btreeEnterAll(db);
      }
      (db->init).iDb = '\0';
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
      iVar16 = 0;
      if (((db->init).field_0x6 & 4) == 0) {
        iVar16 = sqlite3Init(db,&local_70);
      }
      if (*puVar14 == '\0') {
        btreeLeaveAll(db);
      }
      if (iVar16 == 0) {
        return;
      }
    }
    else {
LAB_0019ce09:
      sqlite3_free_filename((char *)p);
    }
    if (((db->init).field_0x6 & 4) != 0) goto LAB_0019ce9d;
    lVar21 = (long)db->nDb + -1;
    pBVar23 = db->aDb[lVar21].pBt;
    if (pBVar23 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar23);
      pDVar18 = db->aDb;
      pDVar18[lVar21].pBt = (Btree *)0x0;
      pDVar18[lVar21].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = (int)lVar21;
    if ((iVar16 == 0xc0a) || (iVar16 == 7)) {
      sqlite3OomFault(db);
      if (local_70 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_70);
      }
      local_70 = sqlite3MPrintf(db,"out of memory");
      goto LAB_0019ce9d;
    }
    if (local_70 == (char *)0x0) {
      pcVar22 = "unable to open database: %s";
      pcVar17 = zUri;
LAB_0019cb66:
      local_70 = sqlite3MPrintf(db,pcVar22,pcVar17);
      goto LAB_0019ce9d;
    }
LAB_0019cea2:
    local_58->isError = 1;
    sqlite3VdbeMemSetStr
              (local_58->pOut,local_70,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    if (local_70 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_70);
    }
  }
  if (iVar16 == 0) {
    return;
  }
LAB_0019cee2:
  sqlite3_result_error_code(local_58,iVar16);
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew = 0;             /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifndef SQLITE_OMIT_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    Btree *pNewBt = 0;
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNewBt, 0, SQLITE_OPEN_MAIN_DB);
    if( rc==SQLITE_OK ){
      Schema *pNewSchema = sqlite3SchemaGet(db, pNewBt);
      if( pNewSchema ){
        /* Both the Btree and the new Schema were allocated successfully.
        ** Close the old db and update the aDb[] slot with the new memdb
        ** values.  */
        pNew = &db->aDb[db->init.iDb];
        if( ALWAYS(pNew->pBt) ) sqlite3BtreeClose(pNew->pBt);
        pNew->pBt = pNewBt;
        pNew->pSchema = pNewSchema;
      }else{
        sqlite3BtreeClose(pNewBt);
        rc = SQLITE_NOMEM;
      }
    }
    if( rc ) goto attach_error;
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d",
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      assert( zName );
      if( sqlite3DbIsNamed(db, i, zName) ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }

    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));

    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db,
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3_free_filename( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( ALWAYS(!REOPEN_AS_MEMDB(db)) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }

  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}